

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslellipticcurve.cpp
# Opt level: O1

QString * __thiscall
QSslEllipticCurve::longName(QString *__return_storage_ptr__,QSslEllipticCurve *this)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QTlsBackend *pQVar4;
  long in_FS_OFFSET;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar4 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar4 != (QTlsBackend *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x120))(&local_38,pQVar4,this->id);
    pQVar1 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_38;
    (__return_storage_ptr__->d).ptr = pcStack_30;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_28;
    local_38 = pQVar1;
    pcStack_30 = pcVar2;
    local_28 = qVar3;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslEllipticCurve::longName() const
{
    QString name;

    if (const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse())
        name = tlsBackend->longNameForId(id);

    return name;
}